

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O0

void __thiscall xercesc_4_0::BMPattern::initialize(BMPattern *this)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  ulong uVar4;
  uint uVar5;
  XMLCh local_5a;
  int local_50;
  int j;
  int index;
  XMLSize_t diff;
  uint local_38;
  uint uStack_34;
  XMLCh ch;
  uint k;
  uint i;
  ArrayJanitor<char16_t> janLowercase;
  XMLCh *lowercasePattern;
  XMLSize_t patternLen;
  BMPattern *this_local;
  
  XVar2 = XMLString::stringLen(this->fPattern);
  janLowercase.fMemoryManager = (MemoryManager *)0x0;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(ulong)this->fShiftTableLen << 3);
  this->fShiftTable = (XMLSize_t *)CONCAT44(extraout_var,iVar1);
  if ((this->fIgnoreCase & 1U) != 0) {
    pXVar3 = XMLString::replicate(this->fPattern,this->fMemoryManager);
    this->fUppercasePattern = pXVar3;
    janLowercase.fMemoryManager =
         (MemoryManager *)XMLString::replicate(this->fPattern,this->fMemoryManager);
    XMLString::upperCase(this->fUppercasePattern);
    XMLString::lowerCase((XMLCh *)janLowercase.fMemoryManager);
  }
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&k,(char16_t *)janLowercase.fMemoryManager,
             this->fMemoryManager);
  for (uStack_34 = 0; uStack_34 < this->fShiftTableLen; uStack_34 = uStack_34 + 1) {
    this->fShiftTable[uStack_34] = XVar2;
  }
  for (local_38 = 0; local_38 < XVar2; local_38 = local_38 + 1) {
    uVar4 = (XVar2 - local_38) - 1;
    uVar5 = (uint)(ushort)this->fPattern[local_38] % this->fShiftTableLen;
    if (uVar4 < this->fShiftTable[(int)uVar5]) {
      this->fShiftTable[(int)uVar5] = uVar4;
    }
    if ((this->fIgnoreCase & 1U) != 0) {
      for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
        if (local_50 == 0) {
          local_5a = this->fUppercasePattern[local_38];
        }
        else {
          local_5a = *(XMLCh *)((long)&(janLowercase.fMemoryManager)->_vptr_MemoryManager +
                               (ulong)local_38 * 2);
        }
        uVar5 = (uint)(ushort)local_5a % this->fShiftTableLen;
        if (uVar4 < this->fShiftTable[(int)uVar5]) {
          this->fShiftTable[(int)uVar5] = uVar4;
        }
      }
    }
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&k);
  return;
}

Assistant:

void BMPattern::initialize() {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    XMLCh* lowercasePattern = 0;

    fShiftTable = (XMLSize_t*) fMemoryManager->allocate(fShiftTableLen*sizeof(XMLSize_t)); //new XMLSize_t[fShiftTableLen];

    if (fIgnoreCase) {

        fUppercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        lowercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        XMLString::upperCase(fUppercasePattern);
        XMLString::lowerCase(lowercasePattern);
    }

    ArrayJanitor<XMLCh> janLowercase(lowercasePattern, fMemoryManager);

    for (unsigned int i=0; i< fShiftTableLen; i++)
        fShiftTable[i] = patternLen;

    for (unsigned int k=0; k< patternLen; k++) {

        XMLCh      ch = fPattern[k];
        XMLSize_t diff = patternLen - k - 1;
        int          index = ch % fShiftTableLen;

        if (diff < fShiftTable[index])
            fShiftTable[index] = diff;

        if (fIgnoreCase) {

            for (int j=0; j< 2; j++) {

                ch = (j == 0) ? fUppercasePattern[k] : lowercasePattern[k];
                index = ch % fShiftTableLen;

                if (diff < fShiftTable[index])
                    fShiftTable[index] = diff;
            }
        }
    }
}